

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_path.c
# Opt level: O0

CURLcode Curl_getworkingpath(connectdata *conn,char *homedir,char **path)

{
  int iVar1;
  size_t __n;
  size_t homelen;
  ulong uStack_48;
  CURLcode result;
  size_t working_path_len;
  char *working_path;
  char *real_path;
  Curl_easy *data;
  char **path_local;
  char *homedir_local;
  connectdata *conn_local;
  
  real_path = (char *)conn->data;
  working_path = (char *)0x0;
  data = (Curl_easy *)path;
  path_local = (char **)homedir;
  homedir_local = (char *)conn;
  conn_local._4_4_ =
       Curl_urldecode((Curl_easy *)real_path,(((Curl_easy *)real_path)->state).path,0,
                      (char **)&working_path_len,&stack0xffffffffffffffb8,false);
  if (conn_local._4_4_ == CURLE_OK) {
    if ((*(uint *)(*(long *)(homedir_local + 0x3d0) + 0x80) & 0x10) == 0) {
      if ((*(uint *)(*(long *)(homedir_local + 0x3d0) + 0x80) & 0x20) != 0) {
        if ((uStack_48 < 2) || (*(char *)(working_path_len + 1) != '~')) {
          working_path = (char *)(*Curl_cmalloc)(uStack_48 + 1);
          if (working_path == (char *)0x0) {
            (*Curl_cfree)((void *)working_path_len);
            return CURLE_OUT_OF_MEMORY;
          }
          memcpy(working_path,(void *)working_path_len,uStack_48 + 1);
        }
        else {
          __n = strlen((char *)path_local);
          working_path = (char *)(*Curl_cmalloc)(__n + uStack_48 + 1);
          if (working_path == (char *)0x0) {
            (*Curl_cfree)((void *)working_path_len);
            return CURLE_OUT_OF_MEMORY;
          }
          memcpy(working_path,path_local,__n);
          working_path[__n] = '/';
          working_path[__n + 1] = '\0';
          if (3 < uStack_48) {
            memcpy(working_path + __n + 1,(void *)(working_path_len + 3),uStack_48 - 2);
          }
        }
      }
    }
    else {
      working_path = (char *)(*Curl_cmalloc)(uStack_48 + 1);
      if (working_path == (char *)0x0) {
        (*Curl_cfree)((void *)working_path_len);
        return CURLE_OUT_OF_MEMORY;
      }
      if ((uStack_48 < 4) || (iVar1 = memcmp((void *)working_path_len,"/~/",3), iVar1 != 0)) {
        memcpy(working_path,(void *)working_path_len,uStack_48 + 1);
      }
      else {
        memcpy(working_path,(void *)(working_path_len + 3),uStack_48 + 1);
      }
    }
    (*Curl_cfree)((void *)working_path_len);
    data->next = (Curl_easy *)working_path;
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_getworkingpath(struct connectdata *conn,
                             char *homedir,  /* when SFTP is used */
                             char **path) /* returns the  allocated
                                             real path to work with */
{
  struct Curl_easy *data = conn->data;
  char *real_path = NULL;
  char *working_path;
  size_t working_path_len;
  CURLcode result =
    Curl_urldecode(data, data->state.path, 0, &working_path,
                   &working_path_len, FALSE);
  if(result)
    return result;

  /* Check for /~/, indicating relative to the user's home directory */
  if(conn->handler->protocol & CURLPROTO_SCP) {
    real_path = malloc(working_path_len + 1);
    if(real_path == NULL) {
      free(working_path);
      return CURLE_OUT_OF_MEMORY;
    }
    if((working_path_len > 3) && (!memcmp(working_path, "/~/", 3)))
      /* It is referenced to the home directory, so strip the leading '/~/' */
      memcpy(real_path, working_path + 3, 4 + working_path_len-3);
    else
      memcpy(real_path, working_path, 1 + working_path_len);
  }
  else if(conn->handler->protocol & CURLPROTO_SFTP) {
    if((working_path_len > 1) && (working_path[1] == '~')) {
      size_t homelen = strlen(homedir);
      real_path = malloc(homelen + working_path_len + 1);
      if(real_path == NULL) {
        free(working_path);
        return CURLE_OUT_OF_MEMORY;
      }
      /* It is referenced to the home directory, so strip the
         leading '/' */
      memcpy(real_path, homedir, homelen);
      real_path[homelen] = '/';
      real_path[homelen + 1] = '\0';
      if(working_path_len > 3) {
        memcpy(real_path + homelen + 1, working_path + 3,
               1 + working_path_len -3);
      }
    }
    else {
      real_path = malloc(working_path_len + 1);
      if(real_path == NULL) {
        free(working_path);
        return CURLE_OUT_OF_MEMORY;
      }
      memcpy(real_path, working_path, 1 + working_path_len);
    }
  }

  free(working_path);

  /* store the pointer for the caller to receive */
  *path = real_path;

  return CURLE_OK;
}